

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O2

UOConfig * __thiscall QPDFJob::UOConfig::file(UOConfig *this,string *parameter)

{
  UnderOverlay *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  __lhs = ((this->config->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr)->under_overlay;
  if ((__lhs->filename)._M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)&__lhs->filename);
  }
  else {
    std::operator+(&local_30,&__lhs->which," file already specified");
    usage(&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return this;
}

Assistant:

QPDFJob::UOConfig*
QPDFJob::UOConfig::file(std::string const& parameter)
{
    if (!config->o.m->under_overlay->filename.empty()) {
        usage(config->o.m->under_overlay->which + " file already specified");
    } else {
        config->o.m->under_overlay->filename = parameter;
    }
    return this;
}